

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountPtr.h
# Opt level: O2

RefCountPtr<PDFInteger> * __thiscall
RefCountPtr<PDFInteger>::operator=(RefCountPtr<PDFInteger> *this,PDFInteger *inValue)

{
  if (this->mValue != (PDFInteger *)0x0) {
    RefCountObject::Release((RefCountObject *)this->mValue);
  }
  this->mValue = inValue;
  if (inValue != (PDFInteger *)0x0) {
    RefCountObject::AddRef((RefCountObject *)inValue);
  }
  return this;
}

Assistant:

RefCountPtr<T>&  RefCountPtr<T>::operator =(T* inValue)
{
	if(mValue)
		mValue->Release();
	mValue = inValue;
	if(mValue)
		mValue->AddRef();
	return *this;
}